

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void anon_unknown.dwarf_259311b::SADTestBase::TearDownTestSuite(void)

{
  aom_free((anonymous_namespace)::SADTestBase::source_data8_);
  (anonymous_namespace)::SADTestBase::source_data8_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::reference_data8_);
  (anonymous_namespace)::SADTestBase::reference_data8_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::second_pred8_);
  (anonymous_namespace)::SADTestBase::second_pred8_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::comp_pred8_);
  (anonymous_namespace)::SADTestBase::comp_pred8_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::comp_pred8_test_);
  (anonymous_namespace)::SADTestBase::comp_pred8_test_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::source_data16_);
  (anonymous_namespace)::SADTestBase::source_data16_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::reference_data16_);
  (anonymous_namespace)::SADTestBase::reference_data16_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::second_pred16_);
  (anonymous_namespace)::SADTestBase::second_pred16_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::comp_pred16_);
  (anonymous_namespace)::SADTestBase::comp_pred16_ = (void *)0x0;
  aom_free((anonymous_namespace)::SADTestBase::comp_pred16_test_);
  (anonymous_namespace)::SADTestBase::comp_pred16_test_ = (void *)0x0;
  return;
}

Assistant:

static void TearDownTestSuite() {
    aom_free(source_data8_);
    source_data8_ = nullptr;
    aom_free(reference_data8_);
    reference_data8_ = nullptr;
    aom_free(second_pred8_);
    second_pred8_ = nullptr;
    aom_free(comp_pred8_);
    comp_pred8_ = nullptr;
    aom_free(comp_pred8_test_);
    comp_pred8_test_ = nullptr;
    aom_free(source_data16_);
    source_data16_ = nullptr;
    aom_free(reference_data16_);
    reference_data16_ = nullptr;
    aom_free(second_pred16_);
    second_pred16_ = nullptr;
    aom_free(comp_pred16_);
    comp_pred16_ = nullptr;
    aom_free(comp_pred16_test_);
    comp_pred16_test_ = nullptr;
  }